

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraBddAndPermute(DdHashTable *table,DdManager *ddF,DdNode *bF,DdManager *ddG,DdNode *bG,
                           int *pPermute)

{
  DdNode *f;
  int iVar1;
  abctime aVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *local_d8;
  DdNode *local_c8;
  uint local_b4;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  ptrint fanout;
  int Lev;
  int LevG;
  int LevF;
  DdNode *bVar;
  DdNode *bRes;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bG1;
  DdNode *bG0;
  DdNode *bF1;
  DdNode *bF0;
  int *pPermute_local;
  DdNode *bG_local;
  DdManager *ddG_local;
  DdNode *bF_local;
  DdManager *ddF_local;
  DdHashTable *table_local;
  
  if (bF == (DdNode *)((ulong)ddF->one ^ 1)) {
    table_local = (DdHashTable *)((ulong)ddF->one ^ 1);
  }
  else if (bG == (DdNode *)((ulong)ddG->one ^ 1)) {
    table_local = (DdHashTable *)((ulong)ddF->one ^ 1);
  }
  else {
    table_local = (DdHashTable *)bF;
    if ((bG != ddG->one) &&
       (table_local = (DdHashTable *)cuddHashTableLookup2(table,bF,bG),
       table_local == (DdHashTable *)0x0)) {
      Counter = Counter + 1;
      if ((ddF->TimeStop == 0) || (aVar2 = Abc_Clock(), aVar2 <= ddF->TimeStop)) {
        if ((ddG->TimeStop == 0) || (aVar2 = Abc_Clock(), aVar2 <= ddG->TimeStop)) {
          if (*(int *)((ulong)bF & 0xfffffffffffffffe) == 0x7fffffff) {
            local_9c = *(int *)((ulong)bF & 0xfffffffffffffffe);
          }
          else {
            local_9c = ddF->perm[*(uint *)((ulong)bF & 0xfffffffffffffffe)];
          }
          if (pPermute == (int *)0x0) {
            local_a0 = *(int *)((ulong)bG & 0xfffffffffffffffe);
          }
          else {
            local_a0 = pPermute[*(uint *)((ulong)bG & 0xfffffffffffffffe)];
          }
          if (local_a0 == 0x7fffffff) {
            if (pPermute == (int *)0x0) {
              local_a4 = *(int *)((ulong)bG & 0xfffffffffffffffe);
            }
            else {
              local_a4 = pPermute[*(uint *)((ulong)bG & 0xfffffffffffffffe)];
            }
            local_a8 = local_a4;
          }
          else {
            if (pPermute == (int *)0x0) {
              local_b4 = *(uint *)((ulong)bG & 0xfffffffffffffffe);
            }
            else {
              local_b4 = pPermute[*(uint *)((ulong)bG & 0xfffffffffffffffe)];
            }
            local_a8 = ddF->perm[local_b4];
          }
          iVar1 = Abc_MinInt(local_9c,local_a8);
          if (ddF->size <= iVar1) {
            __assert_fail("Lev < ddF->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddMisc.c"
                          ,0x88e,
                          "DdNode *extraBddAndPermute(DdHashTable *, DdManager *, DdNode *, DdManager *, DdNode *, int *)"
                         );
          }
          f = ddF->vars[ddF->invperm[iVar1]];
          local_c8 = bF;
          pDVar3 = bF;
          if (local_9c <= iVar1) {
            local_c8 = (DdNode *)
                       (*(ulong *)(((ulong)bF & 0xfffffffffffffffe) + 0x10) ^
                       (long)(int)((uint)bF & 1));
            pDVar3 = (DdNode *)
                     (*(ulong *)(((ulong)bF & 0xfffffffffffffffe) + 0x18) ^
                     (long)(int)((uint)bF & 1));
          }
          local_d8 = bG;
          pDVar4 = bG;
          if (local_a8 <= iVar1) {
            local_d8 = (DdNode *)
                       (*(ulong *)(((ulong)bG & 0xfffffffffffffffe) + 0x10) ^
                       (long)(int)((uint)bG & 1));
            pDVar4 = (DdNode *)
                     (*(ulong *)(((ulong)bG & 0xfffffffffffffffe) + 0x18) ^
                     (long)(int)((uint)bG & 1));
          }
          pDVar3 = extraBddAndPermute(table,ddF,pDVar3,ddG,pDVar4,pPermute);
          if (pDVar3 == (DdNode *)0x0) {
            table_local = (DdHashTable *)0x0;
          }
          else {
            *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
            pDVar4 = extraBddAndPermute(table,ddF,local_c8,ddG,local_d8,pPermute);
            if (pDVar4 == (DdNode *)0x0) {
              Cudd_IterDerefBdd(ddF,pDVar3);
              table_local = (DdHashTable *)0x0;
            }
            else {
              *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
              table_local = (DdHashTable *)cuddBddIteRecur(ddF,f,pDVar4,pDVar3);
              if (table_local == (DdHashTable *)0x0) {
                Cudd_IterDerefBdd(ddF,pDVar3);
                Cudd_IterDerefBdd(ddF,pDVar4);
                table_local = (DdHashTable *)0x0;
              }
              else {
                *(int *)(((ulong)table_local & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)table_local & 0xfffffffffffffffe) + 4) + 1;
                Cudd_IterDerefBdd(ddF,pDVar3);
                Cudd_IterDerefBdd(ddF,pDVar4);
                cuddHashTableInsert2
                          (table,bF,bG,(DdNode *)table_local,
                           (ulong)*(uint *)(((ulong)bF & 0xfffffffffffffffe) + 4) *
                           (ulong)*(uint *)(((ulong)bG & 0xfffffffffffffffe) + 4) + -1);
                *(int *)(((ulong)table_local & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)table_local & 0xfffffffffffffffe) + 4) + -1;
              }
            }
          }
        }
        else {
          table_local = (DdHashTable *)0x0;
        }
      }
      else {
        table_local = (DdHashTable *)0x0;
      }
    }
  }
  return (DdNode *)table_local;
}

Assistant:

DdNode * extraBddAndPermute( DdHashTable * table, DdManager * ddF, DdNode * bF, DdManager * ddG, DdNode * bG, int * pPermute )
{
    DdNode * bF0, * bF1, * bG0, * bG1, * bRes0, * bRes1, * bRes, * bVar;
    int LevF, LevG, Lev;

    // if F == 0, return 0 
    if ( bF == Cudd_Not(ddF->one) )
        return Cudd_Not(ddF->one);
    // if G == 0, return 0 
    if ( bG == Cudd_Not(ddG->one) )
        return Cudd_Not(ddF->one);
    // if G == 1, return F
    if ( bG == ddG->one )
        return bF;
    // cannot use F == 1, because the var order of G has to be changed

    // check cache
    if ( //(Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1) && 
         (bRes = cuddHashTableLookup2(table, bF, bG)) )
        return bRes;
    Counter++;

    if ( ddF->TimeStop && Abc_Clock() > ddF->TimeStop )
        return NULL;
    if ( ddG->TimeStop && Abc_Clock() > ddG->TimeStop )
        return NULL;

    // find the topmost variable in F and G using var order of F
    LevF = cuddI( ddF, Cudd_Regular(bF)->index );
    LevG = cuddI( ddF, pPermute ? pPermute[Cudd_Regular(bG)->index] : Cudd_Regular(bG)->index );
    Lev  = Abc_MinInt( LevF, LevG );
    assert( Lev < ddF->size );
    bVar = ddF->vars[ddF->invperm[Lev]];

    // cofactor
    bF0 = (Lev < LevF) ? bF : Cudd_NotCond( cuddE(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bF1 = (Lev < LevF) ? bF : Cudd_NotCond( cuddT(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bG0 = (Lev < LevG) ? bG : Cudd_NotCond( cuddE(Cudd_Regular(bG)), Cudd_IsComplement(bG) );
    bG1 = (Lev < LevG) ? bG : Cudd_NotCond( cuddT(Cudd_Regular(bG)), Cudd_IsComplement(bG) );

    // call for cofactors
    bRes0 = extraBddAndPermute( table, ddF, bF0, ddG, bG0, pPermute );
    if ( bRes0 == NULL ) 
        return NULL;
    cuddRef( bRes0 );
    // call for cofactors
    bRes1 = extraBddAndPermute( table, ddF, bF1, ddG, bG1, pPermute );
    if ( bRes1 == NULL ) 
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        return NULL;
    }
    cuddRef( bRes1 );

    // compose the result
    bRes = cuddBddIteRecur( ddF, bVar, bRes1, bRes0 );
    if ( bRes == NULL )
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        Cudd_IterDerefBdd( ddF, bRes1 );
        return NULL;
    }
    cuddRef( bRes );
    Cudd_IterDerefBdd( ddF, bRes0 );
    Cudd_IterDerefBdd( ddF, bRes1 );

    // cache the result
//    if ( Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1 )
    {
        ptrint fanout = (ptrint)Cudd_Regular(bF)->ref * Cudd_Regular(bG)->ref;
        cuddSatDec(fanout);
        cuddHashTableInsert2( table, bF, bG, bRes, fanout );
    }
    cuddDeref( bRes );
    return bRes;
}